

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O2

void __thiscall
embree::ParallelRadixSort<embree::avx::BVHBuilderMorton::BuildPrim,_unsigned_int>::sort
          (ParallelRadixSort<embree::avx::BVHBuilderMorton::BuildPrim,_unsigned_int> *this,
          size_t blockSize)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  size_t numTasks;
  
  uVar3 = this->N;
  if (blockSize < uVar3) {
    uVar2 = ((uVar3 + blockSize) - 1) / blockSize;
    iVar1 = tbb::detail::d1::max_concurrency();
    uVar3 = (long)iVar1;
    if (uVar2 < (ulong)(long)iVar1) {
      uVar3 = uVar2;
    }
    numTasks = 0x40;
    if (uVar3 < 0x40) {
      numTasks = uVar3;
    }
    tbbRadixSort(this,numTasks);
    return;
  }
  std::
  __sort<embree::avx::BVHBuilderMorton::BuildPrim*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(embree::avx::BVHBuilderMorton::BuildPrim_const&,embree::avx::BVHBuilderMorton::BuildPrim_const&)>>
            (this->src,this->src + uVar3,
             (_Iter_comp_iter<bool_(*)(const_embree::avx::BVHBuilderMorton::BuildPrim_&,_const_embree::avx::BVHBuilderMorton::BuildPrim_&)>
              )0xdf39f4);
  return;
}

Assistant:

void sort(const size_t blockSize)
    {
      assert(blockSize > 0);
      
      /* perform single threaded sort for small N */
      if (N<=blockSize) // handles also special case of 0!
      {	  
        /* do inplace sort inside destination array */
        std::sort(src,src+N,compare<Ty>);
      }
      
      /* perform parallel sort for large N */
      else 
      {
        const size_t numThreads = min((N+blockSize-1)/blockSize,TaskScheduler::threadCount(),size_t(MAX_TASKS));
        tbbRadixSort(numThreads);
      }
    }